

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_udp.c
# Opt level: O0

void nni_posix_udp_doerror(nni_plat_udp *udp,int rv)

{
  bool bVar1;
  nni_aio *local_20;
  nni_aio *aio;
  int rv_local;
  nni_plat_udp *udp_local;
  
  while( true ) {
    local_20 = (nni_aio *)nni_list_first(&udp->udp_recvq);
    bVar1 = true;
    if (local_20 == (nni_aio *)0x0) {
      local_20 = (nni_aio *)nni_list_first(&udp->udp_sendq);
      bVar1 = local_20 != (nni_aio *)0x0;
    }
    if (!bVar1) break;
    nni_aio_list_remove(local_20);
    nni_aio_finish_error(local_20,rv);
  }
  return;
}

Assistant:

static void
nni_posix_udp_doerror(nni_plat_udp *udp, int rv)
{
	nni_aio *aio;

	while (((aio = nni_list_first(&udp->udp_recvq)) != NULL) ||
	    ((aio = nni_list_first(&udp->udp_sendq)) != NULL)) {
		nni_aio_list_remove(aio);
		nni_aio_finish_error(aio, rv);
	}
}